

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

CuePoint * __thiscall mkvparser::Cues::GetFirst(Cues *this)

{
  longlong lVar1;
  long in_RDI;
  CuePoint *pCP;
  CuePoint **pp;
  CuePoint *local_8;
  
  if ((*(long *)(in_RDI + 0x28) == 0) || (*(long *)(in_RDI + 0x30) == 0)) {
    local_8 = (CuePoint *)0x0;
  }
  else if (*(undefined8 **)(in_RDI + 0x28) == (undefined8 *)0x0) {
    local_8 = (CuePoint *)0x0;
  }
  else {
    local_8 = (CuePoint *)**(undefined8 **)(in_RDI + 0x28);
    if ((local_8 == (CuePoint *)0x0) || (lVar1 = CuePoint::GetTimeCode(local_8), lVar1 < 0)) {
      local_8 = (CuePoint *)0x0;
    }
  }
  return local_8;
}

Assistant:

const CuePoint* Cues::GetFirst() const {
  if (m_cue_points == NULL || m_count == 0)
    return NULL;

  CuePoint* const* const pp = m_cue_points;
  if (pp == NULL)
    return NULL;

  CuePoint* const pCP = pp[0];
  if (pCP == NULL || pCP->GetTimeCode() < 0)
    return NULL;

  return pCP;
}